

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

int mg_path_equal(mg_path *lhs,mg_path *rhs)

{
  int iVar1;
  mg_node *in_RSI;
  uint *in_RDI;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar2;
  int local_4;
  
  if (((*in_RDI == (uint)in_RSI->id) && (in_RDI[1] == *(uint *)((long)&in_RSI->id + 4))) &&
     (in_RDI[2] == in_RSI->label_count)) {
    for (uVar2 = 0; uVar2 < *in_RDI; uVar2 = uVar2 + 1) {
      iVar1 = mg_node_equal(in_RSI,(mg_node *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
      if (iVar1 == 0) {
        return 0;
      }
    }
    for (uVar2 = 0; uVar2 < in_RDI[1]; uVar2 = uVar2 + 1) {
      iVar1 = mg_unbound_relationship_equal
                        ((mg_unbound_relationship *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         (mg_unbound_relationship *)0x1116d9);
      if (iVar1 == 0) {
        return 0;
      }
    }
    for (uVar2 = 0; uVar2 < in_RDI[2]; uVar2 = uVar2 + 1) {
      if (*(long *)(*(long *)(in_RDI + 8) + (ulong)uVar2 * 8) !=
          *(long *)(in_RSI[1].id + (ulong)uVar2 * 8)) {
        return 0;
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mg_path_equal(const mg_path *lhs, const mg_path *rhs) {
  if (lhs->node_count != rhs->node_count ||
      lhs->relationship_count != rhs->relationship_count ||
      lhs->sequence_length != rhs->sequence_length) {
    return 0;
  }
  for (uint32_t i = 0; i < lhs->node_count; ++i) {
    if (!mg_node_equal(lhs->nodes[i], rhs->nodes[i])) {
      return 0;
    }
  }
  for (uint32_t i = 0; i < lhs->relationship_count; ++i) {
    if (!mg_unbound_relationship_equal(lhs->relationships[i],
                                       rhs->relationships[i])) {
      return 0;
    }
  }
  for (uint32_t i = 0; i < lhs->sequence_length; ++i) {
    if (lhs->sequence[i] != rhs->sequence[i]) {
      return 0;
    }
  }
  return 1;
}